

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O0

void ShiftBytes(VP8LBitReader *br)

{
  int iVar1;
  VP8LBitReader *in_RDI;
  bool bVar2;
  
  while( true ) {
    bVar2 = false;
    if (7 < in_RDI->bit_pos) {
      bVar2 = in_RDI->pos < in_RDI->len;
    }
    if (!bVar2) break;
    in_RDI->val = in_RDI->val >> 8;
    in_RDI->val = (ulong)in_RDI->buf[in_RDI->pos] << 0x38 | in_RDI->val;
    in_RDI->pos = in_RDI->pos + 1;
    in_RDI->bit_pos = in_RDI->bit_pos + -8;
  }
  iVar1 = VP8LIsEndOfStream(in_RDI);
  if (iVar1 != 0) {
    VP8LSetEndOfStream(in_RDI);
  }
  return;
}

Assistant:

static void ShiftBytes(VP8LBitReader* const br) {
  while (br->bit_pos >= 8 && br->pos < br->len) {
    br->val >>= 8;
    br->val |= ((vp8l_val_t)br->buf[br->pos]) << (VP8L_LBITS - 8);
    ++br->pos;
    br->bit_pos -= 8;
  }
  if (VP8LIsEndOfStream(br)) {
    VP8LSetEndOfStream(br);
  }
}